

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O1

void __thiscall ExecutorRegVm::Resume(ExecutorRegVm *this)

{
  if (this->execErrorFinalReturnDepth <= (this->callStack).count) {
    (this->callStack).count = this->execErrorFinalReturnDepth;
    this->codeRunning = true;
    this->callContinue = true;
    this->execErrorMessage = (char *)0x0;
    *(undefined8 *)&this->execErrorObject = 0;
    *(undefined4 *)((long)&(this->execErrorObject).ptr + 4) = 0;
    return;
  }
  __assert_fail("newSize <= count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x8e,
                "void FastVector<RegVmCmd *>::shrink(unsigned int) [T = RegVmCmd *, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

void ExecutorRegVm::Resume()
{
	callStack.shrink(execErrorFinalReturnDepth);

	codeRunning = true;

	callContinue = true;

	execErrorMessage = NULL;

	execErrorObject.typeID = 0;
	execErrorObject.ptr = NULL;
}